

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.h
# Opt level: O3

void __thiscall test_fixture::~test_fixture(test_fixture *this)

{
  ~test_fixture(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

virtual ~test_fixture() throw()
    {
    }